

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_oom.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_f278::
ARTOOMTest_Node256KeyPrefixSplit_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTOOMTest_Node256KeyPrefixSplit_Test
          (ARTOOMTest_Node256KeyPrefixSplit_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  ARTOOMTest_Node256KeyPrefixSplit_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  ~ARTOOMTest_Node256KeyPrefixSplit_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTOOMTest, Node256KeyPrefixSplit) {
  oom_insert_test<TypeParam>(
      3,
      [](unodb::test::tree_verifier<TypeParam>& verifier) {
        verifier.insert_key_range(20, 49);
#ifdef UNODB_DETAIL_WITH_STATS
        verifier.assert_node_counts({49, 0, 0, 0, 1});
        verifier.assert_growing_inodes({1, 1, 1, 1});
        verifier.assert_key_prefix_splits(0);
#endif  // UNODB_DETAIL_WITH_STATS
      },
      // Insert a value that does share full prefix with the current Node48
      0x100020, unodb::test::test_values[0],
      [](unodb::test::tree_verifier<TypeParam>&
#ifdef UNODB_DETAIL_WITH_STATS
             verifier
#endif  // UNODB_DETAIL_WITH_STATS
      ) {
#ifdef UNODB_DETAIL_WITH_STATS
        verifier.assert_node_counts({50, 1, 0, 0, 1});
        verifier.assert_growing_inodes({2, 1, 1, 1});
        verifier.assert_key_prefix_splits(1);
#endif  // UNODB_DETAIL_WITH_STATS
      });
}